

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void js_async_from_sync_iterator_finalizer(JSRuntime *rt,JSValue val)

{
  int iVar1;
  JSValueUnion *pJVar2;
  JSValueUnion JVar3;
  JSValueUnion JVar4;
  JSValue v;
  JSValue v_00;
  
  if ((((int)val.tag == -1) && (*(short *)((long)val.u.ptr + 6) == 0x30)) &&
     (pJVar2 = *(JSValueUnion **)((long)val.u.ptr + 0x30), pJVar2 != (JSValueUnion *)0x0)) {
    JVar3 = pJVar2[1];
    if (0xfffffff4 < (uint)JVar3.int32) {
      JVar4 = (JSValueUnion)pJVar2->ptr;
      iVar1 = *JVar4.ptr;
      *(int *)JVar4.ptr = iVar1 + -1;
      if (iVar1 < 2) {
        v.tag = (int64_t)JVar3.ptr;
        v.u.ptr = JVar4.ptr;
        __JS_FreeValueRT(rt,v);
      }
    }
    JVar3 = pJVar2[3];
    if (0xfffffff4 < (uint)JVar3.int32) {
      JVar4 = (JSValueUnion)pJVar2[2].ptr;
      iVar1 = *JVar4.ptr;
      *(int *)JVar4.ptr = iVar1 + -1;
      if (iVar1 < 2) {
        v_00.tag = (int64_t)JVar3.ptr;
        v_00.u.ptr = JVar4.ptr;
        __JS_FreeValueRT(rt,v_00);
      }
    }
    (*(rt->mf).js_free)(&rt->malloc_state,pJVar2);
    return;
  }
  return;
}

Assistant:

static void js_async_from_sync_iterator_finalizer(JSRuntime *rt, JSValue val)
{
    JSAsyncFromSyncIteratorData *s =
        JS_GetOpaque(val, JS_CLASS_ASYNC_FROM_SYNC_ITERATOR);
    if (s) {
        JS_FreeValueRT(rt, s->sync_iter);
        JS_FreeValueRT(rt, s->next_method);
        js_free_rt(rt, s);
    }
}